

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QList<QUrl> * __thiscall
QFileDialog::selectedUrls(QList<QUrl> *__return_storage_ptr__,QFileDialog *this)

{
  QFileDialogPrivate *this_00;
  QList<QUrl> *urls;
  long lVar1;
  QString *file;
  long in_FS_OFFSET;
  QUrl local_50;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((this_00->super_QDialogPrivate).nativeDialogInUse == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_004ec49f:
      __stack_chk_fail();
    }
    QFileDialogPrivate::userSelectedFiles(__return_storage_ptr__,this_00);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedFiles((QStringList *)&local_48,this);
    QList<QUrl>::reserve(__return_storage_ptr__,local_48.size);
    if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
      lVar1 = local_48.size * 0x18;
      do {
        QUrl::fromLocalFile((QString *)&local_50);
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
                  ((QMovableArrayOps<QUrl> *)__return_storage_ptr__,(__return_storage_ptr__->d).size
                   ,&local_50);
        QList<QUrl>::end(__return_storage_ptr__);
        QUrl::~QUrl(&local_50);
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != 0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_004ec49f;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QUrl> QFileDialog::selectedUrls() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse) {
        return d->userSelectedFiles();
    } else {
        QList<QUrl> urls;
        const QStringList selectedFileList = selectedFiles();
        urls.reserve(selectedFileList.size());
        for (const QString &file : selectedFileList)
            urls.append(QUrl::fromLocalFile(file));
        return urls;
    }
}